

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

void * stbds_hmdel_key(void *a,size_t elemsize,void *key,size_t keysize,size_t keyoffset,int mode)

{
  stbds_hash_index *ot;
  stbds_hash_bucket *psVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ptrdiff_t pVar5;
  stbds_hash_index *psVar6;
  long lVar7;
  long local_80;
  ptrdiff_t final_index;
  ptrdiff_t old_index;
  int i;
  stbds_hash_bucket *b;
  ptrdiff_t slot;
  void *raw_a;
  stbds_hash_index *table;
  int mode_local;
  size_t keyoffset_local;
  size_t keysize_local;
  void *key_local;
  size_t elemsize_local;
  void *a_local;
  
  if (a == (void *)0x0) {
    a_local = (void *)0x0;
  }
  else {
    lVar4 = (long)a - elemsize;
    ot = *(stbds_hash_index **)(lVar4 + -0x10);
    *(undefined8 *)(lVar4 + -8) = 0;
    a_local = a;
    if ((ot != (stbds_hash_index *)0x0) &&
       (pVar5 = stbds_hm_find_slot(a,elemsize,key,keysize,keyoffset,mode), -1 < pVar5)) {
      psVar1 = ot->storage;
      lVar7 = pVar5 >> 3;
      uVar3 = (uint)pVar5 & 7;
      lVar2 = psVar1[lVar7].index[(int)uVar3];
      if (lVar4 == 0) {
        local_80 = 0;
      }
      else {
        local_80 = *(long *)(lVar4 + -0x20);
      }
      ot->used_count = ot->used_count - 1;
      ot->tombstone_count = ot->tombstone_count + 1;
      *(undefined8 *)(lVar4 + -8) = 1;
      psVar1[lVar7].hash[(int)uVar3] = 1;
      psVar1[lVar7].index[(int)uVar3] = -2;
      if ((mode == 1) && ((ot->string).mode == '\x02')) {
        free(*(void **)((long)a + elemsize * lVar2));
      }
      if (lVar2 != local_80 + -2) {
        memmove((void *)((long)a + elemsize * lVar2),(void *)((long)a + elemsize * (local_80 + -2)),
                elemsize);
        if (mode == 1) {
          b = (stbds_hash_bucket *)
              stbds_hm_find_slot(a,elemsize,*(void **)((long)a + keyoffset + elemsize * lVar2),
                                 keysize,keyoffset,1);
        }
        else {
          b = (stbds_hash_bucket *)
              stbds_hm_find_slot(a,elemsize,(void *)((long)a + keyoffset + elemsize * lVar2),keysize
                                 ,keyoffset,mode);
        }
        ot->storage[(long)b >> 3].index[(int)((uint)b & 7)] = lVar2;
      }
      *(long *)(lVar4 + -0x20) = *(long *)(lVar4 + -0x20) + -1;
      if ((ot->used_count < ot->used_count_shrink_threshold) && (8 < ot->slot_count)) {
        psVar6 = stbds_make_hash_index(ot->slot_count >> 1,ot);
        *(stbds_hash_index **)(lVar4 + -0x10) = psVar6;
        free(ot);
      }
      else if (ot->tombstone_count_threshold < ot->tombstone_count) {
        psVar6 = stbds_make_hash_index(ot->slot_count,ot);
        *(stbds_hash_index **)(lVar4 + -0x10) = psVar6;
        free(ot);
      }
    }
  }
  return a_local;
}

Assistant:

void * stbds_hmdel_key(void *a, size_t elemsize, void *key, size_t keysize, size_t keyoffset, int mode)
{
  if (a == NULL) {
    return 0;
  } else {
    stbds_hash_index *table;
    void *raw_a = STBDS_HASH_TO_ARR(a,elemsize);
    table = (stbds_hash_index *) stbds_header(raw_a)->hash_table;
    stbds_temp(raw_a) = 0;
    if (table == 0) {
      return a;
    } else {
      ptrdiff_t slot;
      slot = stbds_hm_find_slot(a, elemsize, key, keysize, keyoffset, mode);
      if (slot < 0)
        return a;
      else {
        stbds_hash_bucket *b = &table->storage[slot >> STBDS_BUCKET_SHIFT];
        int i = slot & STBDS_BUCKET_MASK;
        ptrdiff_t old_index = b->index[i];
        ptrdiff_t final_index = (ptrdiff_t) stbds_arrlen(raw_a)-1-1; // minus one for the raw_a vs a, and minus one for 'last'
        STBDS_ASSERT(slot < (ptrdiff_t) table->slot_count);
        --table->used_count;
        ++table->tombstone_count;
        stbds_temp(raw_a) = 1;
        STBDS_ASSERT(table->used_count >= 0);
        //STBDS_ASSERT(table->tombstone_count < table->slot_count/4);
        b->hash[i] = STBDS_HASH_DELETED;
        b->index[i] = STBDS_INDEX_DELETED;

        if (mode == STBDS_HM_STRING && table->string.mode == STBDS_SH_STRDUP)
          STBDS_FREE(NULL, *(char**) ((char *) a+elemsize*old_index));

        // if indices are the same, memcpy is a no-op, but back-pointer-fixup will fail, so skip
        if (old_index != final_index) {
          // swap delete
          memmove((char*) a + elemsize*old_index, (char*) a + elemsize*final_index, elemsize);

          // now find the slot for the last element
          if (mode == STBDS_HM_STRING)
            slot = stbds_hm_find_slot(a, elemsize, *(char**) ((char *) a+elemsize*old_index + keyoffset), keysize, keyoffset, mode);
          else
            slot = stbds_hm_find_slot(a, elemsize,  (char* ) a+elemsize*old_index + keyoffset, keysize, keyoffset, mode);
          STBDS_ASSERT(slot >= 0);
          b = &table->storage[slot >> STBDS_BUCKET_SHIFT];
          i = slot & STBDS_BUCKET_MASK;
          STBDS_ASSERT(b->index[i] == final_index);
          b->index[i] = old_index;
        }
        stbds_header(raw_a)->length -= 1;

        if (table->used_count < table->used_count_shrink_threshold && table->slot_count > STBDS_BUCKET_LENGTH) {
          stbds_header(raw_a)->hash_table = stbds_make_hash_index(table->slot_count>>1, table);
          STBDS_FREE(NULL, table);
          STBDS_STATS(++stbds_hash_shrink);
        } else if (table->tombstone_count > table->tombstone_count_threshold) {
          stbds_header(raw_a)->hash_table = stbds_make_hash_index(table->slot_count   , table);
          STBDS_FREE(NULL, table);
          STBDS_STATS(++stbds_hash_rebuild);
        }

        return a;
      }
    }
  }
  /* NOTREACHED */
}